

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v8::detail::write_int_noinline<char,fmt::v8::appender,unsigned__int128>
                   (appender out,write_int_arg<unsigned___int128> arg,
                   basic_format_specs<char> *specs,locale_ref loc)

{
  presentation_type pVar1;
  undefined1 value [16];
  undefined1 n [16];
  undefined1 n_00 [16];
  undefined1 n_01 [16];
  undefined1 n_02 [16];
  back_insert_iterator<fmt::v8::detail::buffer<char>_> it_00;
  bool bVar2;
  int iVar3;
  appender aVar4;
  uint uVar5;
  uint uVar6;
  appender it;
  undefined8 in_stack_ffffffffffffff48;
  undefined5 in_stack_ffffffffffffff50;
  undefined5 uVar7;
  undefined3 in_stack_ffffffffffffff55;
  undefined3 uVar8;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_90;
  write_int_data<char> data;
  undefined1 local_78 [40];
  undefined5 uStack_50;
  undefined3 uStack_4b;
  int iStack_48;
  bool bStack_44;
  
  pVar1 = specs->type;
  uVar8 = arg.abs_value._13_3_;
  uVar7 = arg.abs_value._8_5_;
  local_90 = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  switch(pVar1) {
  case none:
  case dec:
    if (((specs->field_0xa & 1) == 0) ||
       (value._8_5_ = in_stack_ffffffffffffff50, value._0_8_ = in_stack_ffffffffffffff48,
       value._13_3_ = in_stack_ffffffffffffff55,
       bVar2 = write_int_localized<fmt::v8::appender,unsigned__int128,char>
                         ((detail *)&local_90,(appender *)(detail *)arg.abs_value,
                          (unsigned___int128)value,arg.abs_value._8_4_,
                          (basic_format_specs<char> *)(ulong)arg.prefix,(locale_ref)specs), !bVar2))
    {
      n_01._8_5_ = in_stack_ffffffffffffff50;
      n_01._0_8_ = in_stack_ffffffffffffff48;
      n_01._13_3_ = in_stack_ffffffffffffff55;
      iVar3 = count_digits_fallback<unsigned__int128>
                        ((detail *)arg.abs_value,(unsigned___int128)n_01);
      it_00.container = local_90.container;
      if (specs->precision == -1 && specs->width == 0) {
        if (arg.prefix != 0) {
          for (uVar6 = arg.prefix & 0xffffff; uVar6 != 0; uVar6 = uVar6 >> 8) {
            local_78[0] = (char)uVar6;
            buffer<char>::push_back(it_00.container,local_78);
          }
        }
        local_90.container =
             (buffer<char> *)
             write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/spdlog/include/spdlog/fmt/bundled/format.h:1579:41)>
             ::anon_class_64_3_4ecd7a16::anon_class_32_2_ddb8d65b_for_write_digits::operator()
                       ((anon_class_32_2_ddb8d65b_for_write_digits *)&stack0xffffffffffffff48,
                        it_00.container);
      }
      else {
        write_int_data<char>::write_int_data(&data,iVar3,arg.prefix,specs);
        local_78._0_4_ = arg.prefix;
        local_78._8_8_ = data.size;
        local_78._16_8_ = data.padding;
        local_78._32_8_ = (detail *)arg.abs_value;
        uStack_50 = uVar7;
        uStack_4b = uVar8;
        iStack_48 = iVar3;
        local_90.container =
             (buffer<char> *)
             write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_)::_lambda(fmt::v8::appender)_1_>
                       (it_00.container,specs,data.size,(anon_class_64_3_4ecd7a16 *)local_78);
      }
    }
    break;
  case oct:
    n_02._8_5_ = in_stack_ffffffffffffff50;
    n_02._0_8_ = in_stack_ffffffffffffff48;
    n_02._13_3_ = in_stack_ffffffffffffff55;
    iVar3 = count_digits<3,unsigned__int128>((unsigned___int128)n_02);
    if (((specs->field_0x9 & 0x80) != 0) &&
       (((detail *)arg.abs_value != (detail *)0x0 || arg.abs_value._8_8_ != 0) &&
        specs->precision <= iVar3)) {
      uVar6 = 0x3000;
      if (arg.prefix == 0) {
        uVar6 = 0x30;
      }
      arg.prefix = (uVar6 | arg.prefix) + 0x1000000;
    }
    if (specs->precision == -1 && specs->width == 0) {
      if (arg.prefix != 0) {
        for (uVar6 = arg.prefix & 0xffffff; uVar6 != 0; uVar6 = uVar6 >> 8) {
          local_78[0] = (char)uVar6;
          buffer<char>::push_back
                    ((buffer<char> *)
                     out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                     local_78);
        }
      }
      local_90.container =
           (buffer<char> *)
           write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/spdlog/include/spdlog/fmt/bundled/format.h:1612:22)>
           ::anon_class_64_3_4ecd7a16::anon_class_32_2_ddb8d65b_for_write_digits::operator()
                     ((anon_class_32_2_ddb8d65b_for_write_digits *)&stack0xffffffffffffff48,
                      out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    }
    else {
      write_int_data<char>::write_int_data(&data,iVar3,arg.prefix,specs);
      local_78._8_8_ = data.size;
      local_78._16_8_ = data.padding;
      local_78._0_4_ = arg.prefix;
      local_78._32_8_ = (detail *)arg.abs_value;
      uStack_50 = uVar7;
      uStack_4b = uVar8;
      iStack_48 = iVar3;
      local_90.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_)::_lambda(fmt::v8::appender)_1_>
                     (out,specs,data.size,(anon_class_64_3_4ecd7a16 *)local_78);
    }
    break;
  case hex_lower:
  case hex_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar5 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
      uVar6 = uVar5 << 8;
      if (arg.prefix == 0) {
        uVar6 = uVar5;
      }
      arg.prefix = (uVar6 | arg.prefix) + 0x2000000;
    }
    n_00._8_5_ = in_stack_ffffffffffffff50;
    n_00._0_8_ = in_stack_ffffffffffffff48;
    n_00._13_3_ = in_stack_ffffffffffffff55;
    iVar3 = count_digits<4,unsigned__int128>((unsigned___int128)n_00);
    if (specs->precision == -1 && specs->width == 0) {
      if (arg.prefix != 0) {
        for (uVar6 = arg.prefix & 0xffffff; uVar6 != 0; uVar6 = uVar6 >> 8) {
          local_78[0] = (char)uVar6;
          buffer<char>::push_back
                    ((buffer<char> *)
                     out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                     local_78);
        }
      }
      local_90.container =
           (buffer<char> *)
           write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/spdlog/include/spdlog/fmt/bundled/format.h:1590:41)>
           ::anon_class_64_3_4ecd7a16::anon_class_32_3_bd9b568b_for_write_digits::operator()
                     ((anon_class_32_3_bd9b568b_for_write_digits *)&stack0xffffffffffffff48,
                      out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    }
    else {
      write_int_data<char>::write_int_data(&data,iVar3,arg.prefix,specs);
      local_78._8_8_ = data.size;
      local_78._16_8_ = data.padding;
      local_78._0_4_ = arg.prefix;
      local_78._32_8_ = (detail *)arg.abs_value;
      uStack_50 = uVar7;
      uStack_4b = uVar8;
      iStack_48 = iVar3;
      bStack_44 = pVar1 == hex_upper;
      local_90.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_)::_lambda(fmt::v8::appender)_1_>
                     (out,specs,data.size,(anon_class_64_3_4ecd7a16 *)local_78);
    }
    break;
  case bin_lower:
  case bin_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar5 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
      uVar6 = uVar5 << 8;
      if (arg.prefix == 0) {
        uVar6 = uVar5;
      }
      arg.prefix = (uVar6 | arg.prefix) + 0x2000000;
    }
    n._8_5_ = in_stack_ffffffffffffff50;
    n._0_8_ = in_stack_ffffffffffffff48;
    n._13_3_ = in_stack_ffffffffffffff55;
    iVar3 = count_digits<1,unsigned__int128>((unsigned___int128)n);
    if (specs->precision == -1 && specs->width == 0) {
      if (arg.prefix != 0) {
        for (uVar6 = arg.prefix & 0xffffff; uVar6 != 0; uVar6 = uVar6 >> 8) {
          local_78[0] = (char)uVar6;
          buffer<char>::push_back
                    ((buffer<char> *)
                     out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                     local_78);
        }
      }
      local_90.container =
           (buffer<char> *)
           write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/spdlog/include/spdlog/fmt/bundled/format.h:1601:22)>
           ::anon_class_64_3_4ecd7a16::anon_class_32_2_ddb8d65b_for_write_digits::operator()
                     ((anon_class_32_2_ddb8d65b_for_write_digits *)&stack0xffffffffffffff48,
                      out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    }
    else {
      write_int_data<char>::write_int_data(&data,iVar3,arg.prefix,specs);
      local_78._8_8_ = data.size;
      local_78._16_8_ = data.padding;
      local_78._0_4_ = arg.prefix;
      local_78._32_8_ = (detail *)arg.abs_value;
      uStack_50 = uVar7;
      uStack_4b = uVar8;
      iStack_48 = iVar3;
      local_90.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_)::_lambda(fmt::v8::appender)_1_>
                     (out,specs,data.size,(anon_class_64_3_4ecd7a16 *)local_78);
    }
    break;
  default:
    throw_format_error("invalid type specifier");
  case chr:
    aVar4 = write_char<char,fmt::v8::appender>(out,(char)arg.abs_value,specs);
    return (appender)aVar4.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  }
  return (appender)local_90.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}